

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O2

void __thiscall cmake::CleanupCommandsAndMacros(cmake *this)

{
  cmStateSnapshot local_30;
  
  cmState::Reset(&local_30,
                 (this->State)._M_t.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>.
                 _M_t.super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                 super__Head_base<0UL,_cmState_*,_false>._M_head_impl);
  (this->CurrentSnapshot).Position.Position = local_30.Position.Position;
  (this->CurrentSnapshot).State = local_30.State;
  (this->CurrentSnapshot).Position.Tree = local_30.Position.Tree;
  cmState::RemoveUserDefinedCommands
            ((this->State)._M_t.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
             super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
             super__Head_base<0UL,_cmState_*,_false>._M_head_impl);
  cmStateSnapshot::SetDefaultDefinitions(&this->CurrentSnapshot);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmInstalledFile>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmInstalledFile>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmInstalledFile>_>_>
  ::clear(&(this->InstalledFiles)._M_t);
  return;
}

Assistant:

void cmake::CleanupCommandsAndMacros()
{
  this->CurrentSnapshot = this->State->Reset();
  this->State->RemoveUserDefinedCommands();
  this->CurrentSnapshot.SetDefaultDefinitions();
  // FIXME: InstalledFiles probably belongs in the global generator.
  this->InstalledFiles.clear();
}